

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttp2connection_p.cpp
# Opt level: O0

int __thiscall QHttp2Stream::qt_metacall(QHttp2Stream *this,Call _c,int _id,void **_a)

{
  uint in_EDX;
  int in_ESI;
  Call in_EDI;
  void **in_stack_000000a0;
  int in_stack_000000a8;
  Call in_stack_000000ac;
  QObject *in_stack_000000b0;
  undefined4 local_18;
  undefined4 local_4;
  
  local_18 = QObject::qt_metacall(in_EDI,in_ESI,(void **)(ulong)in_EDX);
  local_4 = local_18;
  if (-1 < local_18) {
    if (in_ESI == 0) {
      if (local_18 < 0x15) {
        qt_static_metacall(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a0);
      }
      local_18 = local_18 + -0x15;
    }
    if (in_ESI == 7) {
      if (local_18 < 0x15) {
        qt_static_metacall(in_stack_000000b0,in_stack_000000ac,in_stack_000000a8,in_stack_000000a0);
      }
      local_18 = local_18 + -0x15;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QHttp2Stream::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 21)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 21;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 21)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 21;
    }
    return _id;
}